

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_4chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  exr_coding_channel_info_t *peVar6;
  uint64_t *outall;
  uint8_t *puVar7;
  long lVar8;
  int y;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  
  pvVar5 = decode->unpacked_buffer;
  peVar6 = decode->channels;
  iVar1 = peVar6->width;
  lVar8 = (long)iVar1;
  iVar2 = (decode->chunk).height;
  iVar3 = decode->user_line_end_ignore;
  iVar4 = peVar6->user_line_stride;
  puVar7 = (peVar6->field_12).decode_to_ptr;
  iVar9 = decode->user_line_begin_skip;
  lVar10 = (long)(iVar1 * 8);
  lVar16 = (long)(iVar1 * 8 * iVar9);
  lVar11 = (long)pvVar5 + lVar16;
  iVar12 = 0;
  if (0 < iVar1) {
    iVar12 = iVar1;
  }
  lVar13 = (long)pvVar5 + lVar16 + lVar8 * 6;
  lVar14 = lVar16 + lVar8 * 4 + (long)pvVar5;
  lVar8 = lVar16 + lVar8 * 2 + (long)pvVar5;
  for (; iVar9 < iVar2 - iVar3; iVar9 = iVar9 + 1) {
    for (uVar15 = 0; (uint)(iVar12 * 2) != uVar15; uVar15 = uVar15 + 2) {
      *(ulong *)(puVar7 + uVar15 * 4) =
           CONCAT26(*(undefined2 *)(lVar13 + uVar15),
                    CONCAT24(*(undefined2 *)(lVar14 + uVar15),
                             CONCAT22(*(undefined2 *)(lVar8 + uVar15),
                                      *(undefined2 *)(lVar11 + uVar15))));
    }
    lVar11 = lVar11 + lVar10;
    puVar7 = puVar7 + iVar4;
    lVar13 = lVar13 + lVar10;
    lVar14 = lVar14 + lVar10;
    lVar8 = lVar8 + lVar10;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;
    /* TODO: can do this with sse and do 2 outpixels at once */
    union
    {
        struct
        {
            uint16_t a;
            uint16_t b;
            uint16_t g;
            uint16_t r;
        };
        uint64_t allc;
    } combined;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 8;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        uint64_t* outall = (uint64_t*) out0;
        in0              = (const uint16_t*) srcbuffer;
        in1              = in0 + w;
        in2              = in1 + w;
        in3              = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            combined.a = one_to_native16 (in0[x]);
            combined.b = one_to_native16 (in1[x]);
            combined.g = one_to_native16 (in2[x]);
            combined.r = one_to_native16 (in3[x]);
            outall[x]  = combined.allc;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}